

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void spawn_character(tgestate_t *state,characterstruct_t *charstr)

{
  int iVar1;
  tgestate_t *state_00;
  tgestate_t *state_01;
  byte *in_RSI;
  long in_RDI;
  route_t *route;
  pos8_t *location;
  mappos8_t *doormappos;
  uint8_t target_type;
  room_t room;
  int Z;
  character_class_data_t *metadata;
  character_t character;
  mappos16_t *saved_mappos;
  characterstruct_t *charstr2;
  uint8_t iters;
  vischar_t *vischar;
  undefined4 in_stack_ffffffffffffff98;
  sound_t in_stack_ffffffffffffff9c;
  tgestate_t *in_stack_ffffffffffffffa0;
  vischar_t *in_stack_ffffffffffffffa8;
  tgestate_t *in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb8;
  uint8_t in_stack_ffffffffffffffba;
  undefined1 in_stack_ffffffffffffffbb;
  byte bVar2;
  character_class_data_t *route_00;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  byte bVar3;
  char local_19;
  byte *local_18;
  
  if ((*in_RSI & 0x40) == 0) {
    local_18 = (byte *)(in_RDI + 0x400);
    local_19 = '\a';
    do {
      if (*local_18 == 0xff) {
        *(byte **)(in_RDI + 0x108) = local_18;
        state_00 = (tgestate_t *)(in_RDI + 0x668);
        if (in_RSI[1] == 0) {
          *(ushort *)&state_00->width = (ushort)in_RSI[2] << 3;
          *(ushort *)(in_RDI + 0x66a) = (ushort)in_RSI[3] << 3;
          *(ushort *)(in_RDI + 0x66c) = (ushort)in_RSI[4] << 3;
        }
        else {
          *(ushort *)&state_00->width = (ushort)in_RSI[2];
          *(ushort *)(in_RDI + 0x66a) = (ushort)in_RSI[3];
          *(ushort *)(in_RDI + 0x66c) = (ushort)in_RSI[4];
        }
        iVar1 = collision((tgestate_t *)
                          CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
        if (iVar1 == 0) {
          iVar1 = bounds_check((tgestate_t *)
                               (ulong)CONCAT13(in_stack_ffffffffffffffbb,
                                               CONCAT12(in_stack_ffffffffffffffba,
                                                        in_stack_ffffffffffffffb8)),
                               (vischar_t *)in_stack_ffffffffffffffb0);
        }
        if (iVar1 == 1) {
          return;
        }
        bVar3 = *in_RSI;
        *in_RSI = bVar3 | 0x40;
        bVar3 = bVar3 & 0x1f;
        *local_18 = bVar3;
        local_18[1] = 0;
        route_00 = spawn_character::character_class_data;
        if (((bVar3 != 0) && (route_00 = spawn_character::character_class_data + 1, 0xf < bVar3)) &&
           (route_00 = spawn_character::character_class_data + 2, 0x13 < bVar3)) {
          route_00 = spawn_character::character_class_data + 3;
        }
        *(anim_t ***)(local_18 + 8) = route_00->animbase;
        *(spritedef_t **)(local_18 + 0x28) = route_00->sprite;
        *(undefined4 *)(local_18 + 0x20) = *(undefined4 *)(in_RDI + 0x668);
        *(undefined2 *)(local_18 + 0x24) = *(undefined2 *)(in_RDI + 0x66c);
        bVar2 = *(byte *)(in_RDI + 0x120);
        local_18[0x3c] = bVar2;
        if (bVar2 != 0) {
          play_speaker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          play_speaker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        }
        *(undefined2 *)(local_18 + 2) = *(undefined2 *)(in_RSI + 5);
        state_01 = (tgestate_t *)(in_RSI + 5);
        goto LAB_001112be;
      }
      local_18 = local_18 + 0x40;
      local_19 = local_19 + -1;
    } while (local_19 != '\0');
  }
  return;
LAB_001112be:
  if ((byte)state_01->width == 0) {
LAB_0011138f:
    local_18[7] = 0;
    calc_vischar_isopos_from_vischar
              (state_01,(vischar_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    character_behaviour(state_00,(vischar_t *)CONCAT17(bVar3,in_stack_ffffffffffffffc8));
    return;
  }
  *(undefined1 *)(in_RDI + 0x6f5) = 0;
  in_stack_ffffffffffffffba =
       get_target((tgestate_t *)CONCAT17(bVar3,in_stack_ffffffffffffffc8),(route_t *)route_00,
                  (mappos8_t **)
                  CONCAT44(iVar1,CONCAT13(bVar2,CONCAT12(in_stack_ffffffffffffffba,
                                                         in_stack_ffffffffffffffb8))),
                  (pos8_t **)in_stack_ffffffffffffffb0);
  if (in_stack_ffffffffffffffba != 0xff) {
    if (in_stack_ffffffffffffffba == 0x80) {
      local_18[1] = local_18[1] | 0x40;
      *(short *)(local_18 + 4) = (short)in_stack_ffffffffffffffb0->width;
      local_18[6] = *(byte *)((long)&in_stack_ffffffffffffffb0->width + 2);
    }
    else {
      local_18[4] = in_stack_ffffffffffffffa8->character;
      local_18[5] = in_stack_ffffffffffffffa8->flags;
    }
    goto LAB_0011138f;
  }
  route_ended(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(route_t *)state_01);
  state_01 = (tgestate_t *)(local_18 + 2);
  goto LAB_001112be;
}

Assistant:

void spawn_character(tgestate_t *state, characterstruct_t *charstr)
{
  /**
   * $CD9A: Data for the four classes of characters.
   */
  static const character_class_data_t character_class_data[4] =
  {
    { &animations[0], &sprites[sprite_COMMANDANT_FACING_AWAY_1] },
    { &animations[0], &sprites[sprite_GUARD_FACING_AWAY_1]      },
    { &animations[0], &sprites[sprite_DOG_FACING_AWAY_1]        },
    { &animations[0], &sprites[sprite_PRISONER_FACING_AWAY_1]   },
  };

  vischar_t                    *vischar;      /* was HL/IY */
  uint8_t                       iters;        /* was B */
  characterstruct_t            *charstr2;     /* was DE */
  mappos16_t                   *saved_mappos; /* was HL */
  character_t                   character;    /* was A */
  const character_class_data_t *metadata;     /* was DE */
  int                           Z;            /* flag */
  room_t                        room;         /* was A */
  uint8_t                       target_type;  /* was A */
  const mappos8_t              *doormappos;   /* was HL */
  const pos8_t                 *location;     /* was HL */
  route_t                      *route;        /* was HL */

  assert(state   != NULL);
  assert(charstr != NULL);

  /* Skip spawning if the character is already on-screen. */
  if (charstr->character_and_flags & characterstruct_FLAG_ON_SCREEN)
    return; /* already spawned */

  /* Find an empty slot in the visible character list. */
  vischar = &state->vischars[1];
  iters = vischars_LENGTH - 1;
  do
  {
    if (vischar->character == character_NONE)
      goto found_empty_slot;
    vischar++;
  }
  while (--iters);

  return; /* no spare slot */


found_empty_slot:
  state->IY = vischar;
  charstr2 = charstr; /* Conv: Original points at charstr.room */

  /* Scale coords dependent on which room the character is in. */
  saved_mappos = &state->saved_mappos.pos16;
  if (charstr2->room == room_0_OUTDOORS)
  {
    /* Conv: Unrolled. */
    saved_mappos->u = charstr2->mappos.u * 8;
    saved_mappos->v = charstr2->mappos.v * 8;
    saved_mappos->w = charstr2->mappos.w * 8;
  }
  else
  {
    /* Conv: Unrolled. */
    saved_mappos->u = charstr2->mappos.u;
    saved_mappos->v = charstr2->mappos.v;
    saved_mappos->w = charstr2->mappos.w;
  }

  Z = collision(state);
  if (Z == 0) /* no collision */
    Z = bounds_check(state, vischar);
  if (Z == 1)
    return; /* a character or bounds collision occurred */

  /* Transfer character struct to vischar. */
  character = charstr->character_and_flags | characterstruct_FLAG_ON_SCREEN;
  charstr->character_and_flags = character;

  character &= characterstruct_CHARACTER_MASK;
  vischar->character = character;
  vischar->flags     = 0;

  metadata = &character_class_data[0]; /* Commandant */
  if (character != 0)
  {
    metadata = &character_class_data[1]; /* Guard */
    if (character >= 16)
    {
      metadata = &character_class_data[2]; /* Dog */
      if (character >= 20)
      {
        metadata = &character_class_data[3]; /* Prisoner */
      }
    }
  }

  vischar->animbase  = metadata->animbase;
  vischar->mi.sprite = metadata->sprite;
  memcpy(&vischar->mi.mappos, &state->saved_mappos, sizeof(mappos16_t));

  room = state->room_index;
  vischar->room = room;
  if (room > room_0_OUTDOORS)
  {
    play_speaker(state, sound_CHARACTER_ENTERS_2);
    play_speaker(state, sound_CHARACTER_ENTERS_1);
  }

  vischar->route = charstr->route;

  /* Conv: Removed DE handling here and below which isn't used in this port. */
  route = &charstr->route;
again:
  if (route->index != routeindex_0_HALT) /* if not stood still */
  {
    state->entered_move_a_character = 0;
    target_type = get_target(state, route, &doormappos, &location);
    if (target_type == get_target_ROUTE_ENDS)
    {
      route_ended(state, vischar, &vischar->route);

      /* To match the original code this should now jump to 'again' with 'route'
       * pointing to vischar->route, not charstr->route as used on the first
       * round. */
      route = &vischar->route;

      /* Jump back and try again. */
      goto again;
    }
    else if (target_type == get_target_DOOR)
    {
      vischar->flags |= vischar_FLAGS_TARGET_IS_DOOR;
    }
    if (target_type == get_target_DOOR)
    {
      vischar->target = *doormappos;
    }
    else
    {
      vischar->target.u = location->x;
      vischar->target.v = location->y;
      /* Note: We're not assigning .height here. */
    }
  }

  vischar->counter_and_flags = 0;
  calc_vischar_isopos_from_vischar(state, vischar);
  character_behaviour(state, vischar); /* was tail call */
}